

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O3

void EOPLL_forceRefresh(EOPLL *opll)

{
  int iVar1;
  uint32_t *puVar2;
  long lVar3;
  
  if (opll != (EOPLL *)0x0) {
    puVar2 = &opll->slot[1].update_requests;
    lVar3 = 0;
    do {
      iVar1 = opll->patch_number[lVar3];
      *(EOPLL_PATCH **)(puVar2 + -0x21) = opll->patch + (long)iVar1 * 2;
      *(EOPLL_PATCH **)(puVar2 + -0xf) = opll->patch + (iVar1 * 2 + 1);
      *(undefined1 *)(puVar2 + -0x12) = 0xff;
      *(undefined1 *)puVar2 = 0xff;
      lVar3 = lVar3 + 1;
      puVar2 = puVar2 + 0x24;
    } while (lVar3 != 9);
    lVar3 = 0xfc;
    do {
      opll->reg[lVar3 + -0x30] = 0xff;
      lVar3 = lVar3 + 0x48;
    } while (lVar3 != 0x60c);
  }
  return;
}

Assistant:

void EOPLL_forceRefresh(EOPLL *opll) {
  int i;

  if (opll == NULL)
    return;

  for (i = 0; i < 9; i++) {
    set_patch(opll, i, opll->patch_number[i]);
  }

  for (i = 0; i < 18; i++) {
    request_update(&opll->slot[i], UPDATE_ALL);
  }
}